

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::MemGrow(w3Interp *this)

{
  w3Stack *this_00;
  pointer *ppwVar1;
  uint uVar2;
  Value *pVVar3;
  ulong uVar4;
  w3StackValue local_50;
  
  uVar4 = (long)(this->module_instance->memory).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->module_instance->memory).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this_00 = &this->super_w3Stack;
  pVVar3 = w3Stack::value(this_00,Tag_i32);
  uVar2 = pVVar3->u32;
  w3Stack::AssertTopIsValue(this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  if ((ulong)uVar2 != 0) {
    local_50.tag = Tag_none;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->module_instance->memory,(ulong)uVar2 * 0x10000 + uVar4,&local_50.tag);
  }
  local_50.frame = (w3Frame *)0x0;
  local_50.label.arity = 0;
  local_50.label.continuation = 0;
  local_50.tag = Tag_Value;
  local_50.value.tag = Tag_i32;
  local_50.value._1_7_ = 0;
  local_50.value.value.u64 = uVar4 >> 0x10 & 0xffffffff;
  w3Stack::push_value(this_00,&local_50);
  return;
}

Assistant:

INTERP (MemGrow)
{
    //__debugbreak ();
    int32_t result = -1;
    const size_t previous_size = module_instance->memory.size ();
    const size_t page_growth = pop_u32 ();
    if (page_growth == 0)
    {
        result = (int32_t)(previous_size >> PageShift);
    }
    else
    {
        const size_t new_size = previous_size + (page_growth << PageShift);
        try
        {
            module_instance->memory.resize (new_size, 0);
            result = (int32_t)(previous_size >> PageShift);
        }
        catch (...)
        {
        }
    }
    push_i32 (result);
}